

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void initCompiler(Compiler *compiler,FunctionType type)

{
  int iVar1;
  Compiler *pCVar2;
  ObjFunction *pOVar3;
  ObjString *pOVar4;
  FunctionType in_ESI;
  Compiler *in_RDI;
  Local *local;
  
  in_RDI->enclosing = current;
  in_RDI->function = (ObjFunction *)0x0;
  in_RDI->type = in_ESI;
  in_RDI->localCount = 0;
  in_RDI->scopeDepth = 0;
  pCVar2 = in_RDI;
  pOVar3 = newFunction();
  current = pCVar2;
  current->function = pOVar3;
  if (in_ESI != TYPE_SCRIPT) {
    pOVar4 = copyString((char *)current,in_ESI);
    current->function->name = pOVar4;
  }
  pCVar2 = current;
  iVar1 = current->localCount;
  current->localCount = iVar1 + 1;
  pCVar2->locals[iVar1].depth = 0;
  pCVar2->locals[iVar1].isCaptured = false;
  if (in_ESI == TYPE_FUNCTION) {
    pCVar2->locals[iVar1].name.start = "";
    pCVar2->locals[iVar1].name.length = 0;
  }
  else {
    pCVar2->locals[iVar1].name.start = "this";
    pCVar2->locals[iVar1].name.length = 4;
  }
  return;
}

Assistant:

static void initCompiler(Compiler *compiler, FunctionType type) {
    compiler->enclosing = current;
    compiler->function = NULL;
    compiler->type = type;
    compiler->localCount = 0;
    compiler->scopeDepth = 0;
    compiler->function = newFunction();
    current = compiler;

    if (type != TYPE_SCRIPT) {
        current->function->name = copyString(parser.previous.start, parser.previous.length);
    }

    Local *local = &current->locals[current->localCount++];
    local->depth = 0;
    local->isCaptured = false;
    if (type != TYPE_FUNCTION) {
        local->name.start = "this";
        local->name.length = 4;
    } else {
        local->name.start = "";
        local->name.length = 0;
    }
}